

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.c
# Opt level: O0

void init_view(void)

{
  int j;
  int i;
  
  viewnum = 0;
  for (i = 0; i < 4; i = i + 1) {
    for (j = 0; j < 4; j = j + 1) {
      viewinfo[i].pos[j] = 0.0;
      *(undefined4 *)((long)i * 0x20 + 0x116c10 + (long)j * 4) = 0;
    }
  }
  return;
}

Assistant:

void init_view()
{
   int i, j;

   viewnum = 0;

   for (i=0; i<4; i++) {
      for (j=0; j<4; j++) {
	 viewinfo[i].pos[j] = 0;
	 viewinfo[i].vel[j] = 0;
      }
   }
}